

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

SpecifyBlockSymbol *
slang::ast::SpecifyBlockSymbol::fromSyntax
          (Scope *scope,SpecifyBlockSyntax *syntax,
          SmallVector<const_slang::ast::Symbol_*,_5UL> *implicitSymbols)

{
  group_type_pointer pgVar1;
  Compilation *args;
  size_t sVar2;
  pointer ppMVar3;
  SourceLocation SVar4;
  SyntaxNode *pSVar5;
  long lVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  IdentifierNameSyntax *pIVar8;
  byte bVar9;
  Scope *this;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  byte bVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  char *__s1;
  value_type_pointer pbVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  int iVar43;
  uint uVar44;
  NetType *pNVar45;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar46;
  Symbol *args_00;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  TimingCheckEventArgSyntax *eventArg;
  TransparentMemberSymbol *pTVar50;
  Scope *pSVar51;
  long lVar52;
  undefined1 auVar53 [16];
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  byte bVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  byte bVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  byte bVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  byte bVar69;
  size_t pos;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  string_view local_240;
  Symbol *local_230;
  size_t local_228;
  IdentifierNameSyntax *local_220;
  Scope *local_218;
  ulong local_210;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *local_208;
  SpecifyBlockSymbol *local_200;
  Compilation *local_1f8;
  ulong local_1f0;
  NetType *local_1e8;
  SymbolKind *local_1e0;
  size_t local_1d8;
  ulong local_1d0;
  group_type_pointer local_1c8;
  value_type_pointer local_1c0;
  Compilation *local_1b8;
  undefined1 local_1b0 [64];
  locator local_170;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  byte bStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  byte bStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  byte bStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  byte bStack_149;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  byte bStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  byte bStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  byte bStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  AssertionInstanceDetails *local_100;
  SourceLocation local_f8;
  Storage *local_78;
  Storage *local_70;
  undefined1 local_68 [24];
  value_type_pointer pbStack_50;
  undefined1 local_48 [16];
  
  args = scope->compilation;
  local_218 = scope;
  local_208 = implicitSymbols;
  local_f8 = parsing::Token::location(&syntax->specify);
  local_1b8 = args;
  local_200 = BumpAllocator::
              emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
                        (&args->super_BumpAllocator,args,&local_f8);
  (local_200->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  sVar2 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppMVar3 = (syntax->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar48 = 0;
    do {
      Scope::addMembers(&local_200->super_Scope,*(SyntaxNode **)((long)ppMVar3 + lVar48));
      lVar48 = lVar48 + 8;
    } while (sVar2 << 3 != lVar48);
  }
  local_68._0_8_ = 0x3f;
  local_68._8_8_ = 1;
  stack0xffffffffffffffa8 = ZEXT816(0x4a92e0);
  local_48 = (undefined1  [16])0x0;
  args_00 = (local_200->super_Scope).firstMember;
  local_78 = (Storage *)&local_f8;
  local_70 = (Storage *)&local_f8;
  this = local_218;
  do {
    if (args_00 == (Symbol *)0x0) {
      boost::unordered::detail::foa::
      table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::delete_((allocator_type)local_70,
                (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                 *)local_68);
      return local_200;
    }
    pSVar51 = this;
    if (args_00->kind == SystemTimingCheck) {
      SVar4 = args_00[1].location;
      pNVar45 = Scope::getDefaultNetType(this);
      if ((SVar4 != (SourceLocation)0x0) && (pNVar45->netKind != Unknown)) {
        pSVar5 = args_00->originatingSyntax;
        local_130._8_4_ = 0xffffffff;
        local_100 = (AssertionInstanceDetails *)0x0;
        local_110 = (undefined1  [16])0x0;
        local_120 = (undefined1  [16])0x0;
        local_1b0._0_8_ = local_1b0 + 0x18;
        local_1b0._8_8_ = 0;
        local_1b0._16_8_ = 5;
        pSVar51 = local_218;
        local_130._0_8_ = this;
        if ((byte *)0x1 < (byte *)((long)&(pSVar5[6].previewNode)->kind + 1)) {
          lVar52 = 0;
          lVar48 = 0;
          uVar49 = 0;
          local_230 = args_00;
          local_1e8 = pNVar45;
          do {
            lVar6 = *(long *)((long)SVar4 + 0x10);
            if ((ulong)(*(long *)((long)SVar4 + 0x18) - lVar6 >> 4) <= uVar49) break;
            ppSVar46 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)((long)&(pSVar5[6].parent)->kind + lVar52));
            uVar44 = *(uint *)(lVar6 + lVar48);
            if ((uVar44 < 5) && ((0x15U >> (uVar44 & 0x1f) & 1) != 0)) {
              pSVar7 = *ppSVar46;
              if (pSVar7->kind == TimingCheckEventArg) {
                Expression::findPotentiallyImplicitNets
                          (*(SyntaxNode **)(pSVar7 + 2),(ASTContext *)local_130,
                           (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)local_1b0
                          );
                if (pSVar7[2].parent != (SyntaxNode *)0x0) {
                  Expression::findPotentiallyImplicitNets
                            (pSVar7[2].parent[1].previewNode,(ASTContext *)local_130,
                             (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)
                             local_1b0);
                }
              }
              else if (pSVar7->kind == ExpressionTimingCheckArg) {
                Expression::findPotentiallyImplicitNets
                          (*(SyntaxNode **)(pSVar7 + 1),(ASTContext *)local_130,
                           (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)local_1b0
                          );
              }
            }
            uVar49 = uVar49 + 1;
            lVar48 = lVar48 + 0x10;
            lVar52 = lVar52 + 0x30;
          } while (uVar49 < (ulong)((long)&(pSVar5[6].previewNode)->kind + 1) >> 1);
          args_00 = local_230;
          if (local_1b0._8_8_ != 0) {
            local_1f8 = *(Compilation **)local_130._0_8_;
            local_1e0 = &((Symbol *)local_1b0._0_8_)->kind + local_1b0._8_8_ * 2;
            pTVar50 = (TransparentMemberSymbol *)local_1b0._0_8_;
            do {
              pIVar8 = *(IdentifierNameSyntax **)&pTVar50->super_Symbol;
              local_240 = parsing::Token::valueText(&pIVar8->identifier);
              local_220 = pIVar8;
              local_228 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                      *)&local_70,&local_240);
              uVar49 = local_228 >> (local_68[0] & 0x3f);
              lVar48 = (local_228 & 0xff) * 4;
              uVar54 = (&UNK_004a938c)[lVar48];
              uVar55 = (&UNK_004a938d)[lVar48];
              uVar56 = (&UNK_004a938e)[lVar48];
              bVar57 = (&UNK_004a938f)[lVar48];
              local_1c0 = pbStack_50;
              sVar2 = local_240._M_len;
              __s1 = local_240._M_str;
              local_1d0 = (ulong)((uint)local_228 & 7);
              local_1f0 = local_68._8_8_;
              uVar47 = 0;
              local_1c8 = (group_type_pointer)local_68._16_8_;
              uVar58 = uVar54;
              uVar59 = uVar55;
              uVar60 = uVar56;
              bVar61 = bVar57;
              uVar62 = uVar54;
              uVar63 = uVar55;
              uVar64 = uVar56;
              bVar65 = bVar57;
              uVar66 = uVar54;
              uVar67 = uVar55;
              uVar68 = uVar56;
              bVar69 = bVar57;
              local_1d8 = uVar49;
              do {
                pbVar26 = local_1c0;
                pgVar1 = local_1c8 + uVar49;
                local_148 = pgVar1->m[0].n;
                uStack_147 = pgVar1->m[1].n;
                uStack_146 = pgVar1->m[2].n;
                bStack_145 = pgVar1->m[3].n;
                uStack_144 = pgVar1->m[4].n;
                uStack_143 = pgVar1->m[5].n;
                uStack_142 = pgVar1->m[6].n;
                bStack_141 = pgVar1->m[7].n;
                uStack_140 = pgVar1->m[8].n;
                uStack_13f = pgVar1->m[9].n;
                uStack_13e = pgVar1->m[10].n;
                bStack_13d = pgVar1->m[0xb].n;
                uStack_13c = pgVar1->m[0xc].n;
                uStack_13b = pgVar1->m[0xd].n;
                uStack_13a = pgVar1->m[0xe].n;
                bVar9 = pgVar1->m[0xf].n;
                auVar53[0] = -(local_148 == uVar54);
                auVar53[1] = -(uStack_147 == uVar55);
                auVar53[2] = -(uStack_146 == uVar56);
                auVar53[3] = -(bStack_145 == bVar57);
                auVar53[4] = -(uStack_144 == uVar58);
                auVar53[5] = -(uStack_143 == uVar59);
                auVar53[6] = -(uStack_142 == uVar60);
                auVar53[7] = -(bStack_141 == bVar61);
                auVar53[8] = -(uStack_140 == uVar62);
                auVar53[9] = -(uStack_13f == uVar63);
                auVar53[10] = -(uStack_13e == uVar64);
                auVar53[0xb] = -(bStack_13d == bVar65);
                auVar53[0xc] = -(uStack_13c == uVar66);
                auVar53[0xd] = -(uStack_13b == uVar67);
                auVar53[0xe] = -(uStack_13a == uVar68);
                auVar53[0xf] = -(bVar9 == bVar69);
                local_210 = uVar49;
                bStack_139 = bVar9;
                uVar27 = uVar54;
                uVar28 = uVar55;
                uVar29 = uVar56;
                bVar30 = bVar57;
                uVar31 = uVar58;
                uVar32 = uVar59;
                uVar33 = uVar60;
                bVar34 = bVar61;
                uVar35 = uVar62;
                uVar36 = uVar63;
                uVar37 = uVar64;
                bVar38 = bVar65;
                uVar39 = uVar66;
                uVar40 = uVar67;
                uVar41 = uVar68;
                bVar42 = bVar69;
                uVar10 = local_158;
                uVar11 = uStack_157;
                uVar12 = uStack_156;
                bVar13 = bStack_155;
                uVar14 = uStack_154;
                uVar15 = uStack_153;
                uVar16 = uStack_152;
                bVar17 = bStack_151;
                uVar18 = uStack_150;
                uVar19 = uStack_14f;
                uVar20 = uStack_14e;
                bVar21 = bStack_14d;
                uVar22 = uStack_14c;
                uVar23 = uStack_14b;
                uVar24 = uStack_14a;
                bVar25 = bStack_149;
                for (uVar44 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe);
                    bStack_149 = bVar42, uStack_14a = uVar41, uStack_14b = uVar40,
                    uStack_14c = uVar39, bStack_14d = bVar38, uStack_14e = uVar37,
                    uStack_14f = uVar36, uStack_150 = uVar35, bStack_151 = bVar34,
                    uStack_152 = uVar33, uStack_153 = uVar32, uStack_154 = uVar31,
                    bStack_155 = bVar30, uStack_156 = uVar29, uStack_157 = uVar28,
                    local_158 = uVar27, uVar44 != 0; uVar44 = uVar44 - 1 & uVar44) {
                  iVar43 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
                    }
                  }
                  if ((sVar2 == *(size_t *)
                                 ((long)&pbVar26[uVar49 * 0xf]._M_len + (ulong)(uint)(iVar43 << 4)))
                     && ((sVar2 == 0 ||
                         (iVar43 = bcmp(__s1,*(void **)((long)&pbVar26[uVar49 * 0xf]._M_str +
                                                       (ulong)(uint)(iVar43 << 4)),sVar2),
                         uVar54 = local_158, uVar55 = uStack_157, uVar56 = uStack_156,
                         bVar57 = bStack_155, uVar58 = uStack_154, uVar59 = uStack_153,
                         uVar60 = uStack_152, bVar61 = bStack_151, uVar62 = uStack_150,
                         uVar63 = uStack_14f, uVar64 = uStack_14e, bVar65 = bStack_14d,
                         uVar66 = uStack_14c, uVar67 = uStack_14b, uVar68 = uStack_14a,
                         bVar69 = bStack_149, iVar43 == 0)))) goto LAB_00283312;
                  uVar27 = local_158;
                  uVar28 = uStack_157;
                  uVar29 = uStack_156;
                  bVar30 = bStack_155;
                  uVar31 = uStack_154;
                  uVar32 = uStack_153;
                  uVar33 = uStack_152;
                  bVar34 = bStack_151;
                  uVar35 = uStack_150;
                  uVar36 = uStack_14f;
                  uVar37 = uStack_14e;
                  bVar38 = bStack_14d;
                  uVar39 = uStack_14c;
                  uVar40 = uStack_14b;
                  uVar41 = uStack_14a;
                  bVar42 = bStack_149;
                  uVar10 = local_158;
                  uVar11 = uStack_157;
                  uVar12 = uStack_156;
                  bVar13 = bStack_155;
                  uVar14 = uStack_154;
                  uVar15 = uStack_153;
                  uVar16 = uStack_152;
                  bVar17 = bStack_151;
                  uVar18 = uStack_150;
                  uVar19 = uStack_14f;
                  uVar20 = uStack_14e;
                  bVar21 = bStack_14d;
                  uVar22 = uStack_14c;
                  uVar23 = uStack_14b;
                  uVar24 = uStack_14a;
                  bVar25 = bStack_149;
                }
                local_158 = uVar10;
                uStack_157 = uVar11;
                uStack_156 = uVar12;
                bStack_155 = bVar13;
                uStack_154 = uVar14;
                uStack_153 = uVar15;
                uStack_152 = uVar16;
                bStack_151 = bVar17;
                uStack_150 = uVar18;
                uStack_14f = uVar19;
                uStack_14e = uVar20;
                bStack_14d = bVar21;
                uStack_14c = uVar22;
                uStack_14b = uVar23;
                uStack_14a = uVar24;
                bStack_149 = bVar25;
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[local_1d0] & bVar9) == 0) break;
                lVar48 = local_210 + uVar47;
                uVar47 = uVar47 + 1;
                uVar49 = lVar48 + 1U & local_1f0;
              } while (uVar47 <= local_1f0);
              if ((ulong)local_48._8_8_ < (ulong)local_48._0_8_) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_170,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_70,(arrays_type *)local_68,local_1d8,local_228,&local_240);
                local_48._8_8_ = local_48._8_8_ + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                          (&local_170,
                           (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                            *)&local_70,local_228,&local_240);
              }
              local_170.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                             NetSymbol::createImplicit(local_1f8,local_220,local_1e8);
              SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_208,
                         (Symbol **)&local_170);
LAB_00283312:
              pTVar50 = (TransparentMemberSymbol *)&(pTVar50->super_Symbol).name;
            } while (pTVar50 != (TransparentMemberSymbol *)local_1e0);
          }
          pSVar51 = local_218;
          if ((TransparentMemberSymbol *)local_1b0._0_8_ !=
              (TransparentMemberSymbol *)(local_1b0 + 0x18)) {
            operator_delete((void *)local_1b0._0_8_);
            pSVar51 = local_218;
          }
        }
      }
    }
    else if (args_00->kind == Specparam) {
      local_1b0._0_8_ =
           BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                     (&local_1b8->super_BumpAllocator,args_00);
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_208,(Symbol **)local_1b0);
    }
    args_00 = args_00->nextInScope;
    this = pSVar51;
  } while( true );
}

Assistant:

SpecifyBlockSymbol& SpecifyBlockSymbol::fromSyntax(const Scope& scope,
                                                   const SpecifyBlockSyntax& syntax,
                                                   SmallVector<const Symbol*>& implicitSymbols) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SpecifyBlockSymbol>(comp, syntax.specify.location());
    result->setSyntax(syntax);

    for (auto member : syntax.items)
        result->addMembers(*member);

    SmallSet<std::string_view, 8> implicitNetNames;

    for (auto member = result->getFirstMember(); member; member = member->getNextSibling()) {
        if (member->kind == SymbolKind::Specparam) {
            // specparams inside specify blocks get visibility in the parent scope as well.
            implicitSymbols.push_back(comp.emplace<TransparentMemberSymbol>(*member));
        }
        else if (member->kind == SymbolKind::SystemTimingCheck) {
            // some system timing checks can create implicit nets
            auto& timingCheck = member->as<SystemTimingCheckSymbol>();
            createImplicitNets(timingCheck, timingCheck.def, scope, implicitSymbols,
                               implicitNetNames);
        }
    }

    return *result;
}